

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void * disk_read_thread(void *args)

{
  fdb_status fVar1;
  int iVar2;
  uint64_t in_RDI;
  storage_t *st;
  person_t p;
  fdb_doc *doc;
  fdb_status status;
  fdb_kvs_handle *snap_db;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  int seqno;
  uint64_t i;
  int n;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  void *in_stack_fffffffffffff150;
  uint64_t size;
  fdb_snapshot_info_t *in_stack_fffffffffffff158;
  void *in_stack_fffffffffffff160;
  fdb_doc **in_stack_fffffffffffff168;
  size_t in_stack_fffffffffffff180;
  fdb_seqnum_t in_stack_fffffffffffff3f0;
  fdb_kvs_handle **in_stack_fffffffffffff3f8;
  fdb_kvs_handle *in_stack_fffffffffffff400;
  int local_9c;
  fdb_doc *local_98;
  fdb_kvs_handle *local_88;
  long local_80;
  ulong local_78;
  ulong local_68;
  int local_5c;
  timeval local_18;
  uint64_t local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  fdb_doc_create(in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                 (size_t)in_stack_fffffffffffff158,in_stack_fffffffffffff150,0,(void *)0x105b36,
                 in_stack_fffffffffffff180);
  local_5c = 0;
  size = local_8;
  do {
    if (9 < local_5c) {
      fdb_doc_free((fdb_doc *)0x105de2);
      return (void *)0x0;
    }
    fVar1 = fdb_get_all_snap_markers
                      ((fdb_file_handle *)p.key._676_8_,(fdb_snapshot_info_t **)p.key._668_8_,
                       (uint64_t *)p.key._660_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,700);
      disk_read_thread::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,700,"void *disk_read_thread(void *)");
      }
    }
    for (local_68 = 0; local_68 < local_78; local_68 = local_68 + 1) {
      iVar2 = (int)*(undefined8 *)(*(long *)(local_80 + local_68 * 0x18 + 0x10) + 8);
      if ((iVar2 != 0) &&
         (fVar1 = fdb_snapshot_open(in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
                                    in_stack_fffffffffffff3f0), fVar1 == FDB_RESULT_SUCCESS)) {
        local_98->seqnum = (long)iVar2;
        fVar1 = fdb_get_byseq(local_88,local_98);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                  ,0x2c8);
          disk_read_thread::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                          ,0x2c8,"void *disk_read_thread(void *)");
          }
        }
        memcpy(&stack0xfffffffffffff15c,local_98->body,0xe0c);
        if (iVar2 < local_9c) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                  ,0x2cc);
          disk_read_thread::__test_pass = 0;
          if (iVar2 < local_9c) {
            __assert_fail("p.age <= seqno",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                          ,0x2cc,"void *disk_read_thread(void *)");
          }
        }
      }
    }
    fdb_free_snap_markers(in_stack_fffffffffffff158,size);
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

void *disk_read_thread(void *args) {
    TEST_INIT();
    int n;
    uint64_t i;
    int seqno;
    uint64_t num_markers;
    fdb_snapshot_info_t *markers;
    fdb_kvs_handle *snap_db;
    fdb_status status;
    fdb_doc *doc;
    person_t p;
    fdb_doc_create(&doc, NULL, 0, NULL, 0, NULL, 0);

    storage_t *st = (storage_t *)args;

    for (n = 0; n < 10; ++n) {
        status = fdb_get_all_snap_markers(st->main, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        for (i = 0; i < num_markers; i++) {
            // open disk snapshot to each marker
            seqno = markers[i].kvs_markers[0].seqnum;
            if (!seqno) {
                continue;
            }
            status = fdb_snapshot_open(st->all_docs, &snap_db, seqno);
            if (status == FDB_RESULT_SUCCESS) {
                doc->seqnum = seqno;
                // can get doc
                status = fdb_get_byseq(snap_db, doc);
                TEST_CHK(status == FDB_RESULT_SUCCESS);

                // verify
                memcpy(&p, (person_t *)doc->body, sizeof(person_t));
                TEST_CHK(p.age <= seqno)
            }
        }
        fdb_free_snap_markers(markers, num_markers);
    }

    fdb_doc_free(doc);
    return NULL;
}